

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::EbmlDateElementSize(uint64 type)

{
  uint64 uVar1;
  
  uVar1 = 10;
  if ((((0xff < type) && (uVar1 = 0xb, 0xffff < type)) && (uVar1 = 0xc, 0xffffff < type)) &&
     (((uVar1 = 0xd, type >> 0x20 != 0 && (uVar1 = 0xe, type >> 0x28 != 0)) &&
      (uVar1 = 0xf, type >> 0x30 != 0)))) {
    uVar1 = 0x11 - (ulong)(type >> 0x38 == 0);
  }
  return uVar1;
}

Assistant:

uint64 EbmlDateElementSize(uint64 type) {
  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += kDateElementSize;

  // Size of Datasize
  ebml_size++;

  return ebml_size;
}